

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O0

void __thiscall vw::vw(vw *this,vw *param_2)

{
  undefined8 uVar1;
  long in_RDI;
  char *pfile;
  vw_exception *this_00;
  string *pmessage;
  stringstream __msg;
  stack<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::deque<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>_>
  *in_stack_fffffffffffffd40;
  parameters *in_stack_fffffffffffffd50;
  int plineNumber;
  long local_200;
  stringstream local_1a8 [16];
  ostream local_198;
  
  std::thread::thread((thread *)0x12a5a8);
  std::__cxx11::string::string((string *)(in_RDI + 0x60));
  std::__cxx11::string::string((string *)(in_RDI + 0xa0));
  version_struct::version_struct((version_struct *)(in_RDI + 0xc0),0,0,0);
  *(undefined1 *)(in_RDI + 0xd8) = 0;
  vw_ostream::vw_ostream((vw_ostream *)in_stack_fffffffffffffd50);
  *(undefined1 *)(in_RDI + 0x270) = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a63e);
  std::__cxx11::string::string((string *)(in_RDI + 0x2a8));
  std::__cxx11::string::string((string *)(in_RDI + 0x2c8));
  std::__cxx11::string::string((string *)(in_RDI + 0x2e8));
  std::__cxx11::string::string((string *)(in_RDI + 0x308));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a6be);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a6da);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a6f6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a712);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a72e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a74a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a766);
  local_200 = in_RDI + 0x1c18;
  do {
    std::
    vector<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
    ::vector((vector<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
              *)0x12a7a8);
    local_200 = local_200 + 0x18;
  } while (local_200 != in_RDI + 0x3418);
  pfile = (char *)(in_RDI + 0x3418);
  std::vector<dictionary_info,_std::allocator<dictionary_info>_>::vector
            ((vector<dictionary_info,_std::allocator<dictionary_info>_> *)0x12a7df);
  this_00 = (vw_exception *)(in_RDI + 0x3480);
  std::__cxx11::string::string((string *)this_00);
  std::__cxx11::string::string((string *)(in_RDI + 0x34a0));
  std::
  stack<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>>
  ::
  stack<std::deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>,void>
            (in_stack_fffffffffffffd40);
  pmessage = (string *)(in_RDI + 0x3570);
  std::__cxx11::string::string((string *)pmessage);
  plineNumber = (int)((ulong)(in_RDI + 0x3590) >> 0x20);
  parameters::parameters(in_stack_fffffffffffffd50);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         *)0x12a879);
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(&local_198,"Copy constructor not supported");
  uVar1 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception(this_00,pfile,plineNumber,pmessage);
  __cxa_throw(uVar1,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

vw::vw(const vw&) { THROW("Copy constructor not supported"); }